

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNnameConstraintsTest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section13InvalidDNnameConstraintsTest2
          (Section13InvalidDNnameConstraintsTest2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNnameConstraintsTest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDN1CACert",
                               "InvalidDNnameConstraintsTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN1CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}